

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_str0(char *data,char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *str_local;
  char *data_local;
  
  sVar1 = strlen(str);
  pcVar2 = mp_encode_str(data,str,(uint32_t)sVar1);
  return pcVar2;
}

Assistant:

MP_IMPL char *
mp_encode_str0(char *data, const char *str)
{
	return mp_encode_str(data, str, strlen(str));
}